

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

Reg asm_fuseloadk64(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  int iVar2;
  IRIns *pIVar3;
  MCode *pMVar4;
  IRIns *pIVar5;
  uint8_t uVar6;
  
  pIVar3 = ir + 1;
  uVar6 = 0x80;
  pIVar5 = pIVar3;
  if ((IRIns *)(long)(int)pIVar3 != pIVar3) {
    pIVar5 = (IRIns *)((long)pIVar3 + (-0xcc8 - (long)as->J));
    uVar6 = '\x0e';
    if ((IRIns *)(long)(int)pIVar5 != pIVar5) {
      pMVar4 = as->mcp;
      pIVar3 = (IRIns *)((long)pIVar3 - (long)pMVar4);
      if ((((IRIns *)(long)(int)pIVar3 != pIVar3) ||
          ((ulong)((long)ir + (0x80000010 - (long)pMVar4)) >> 0x20 != 0)) ||
         (uVar6 = '%', pIVar5 = pIVar3,
         (ulong)((long)ir + (0x80000010 - (long)as->mctop) |
                (long)ir + (0x80000008 - (long)as->mctop)) >> 0x20 != 0)) {
        iVar2 = ir->i;
        if (iVar2 == 0) {
          while (pIVar3 = (IRIns *)as->mcbot, ((ulong)pIVar3 & 7) != 0) {
            as->mcbot = (MCode *)((long)&(pIVar3->field_0).op1 + 1);
            *(undefined1 *)pIVar3 = 0xcc;
          }
          *pIVar3 = ir[1];
          (ir->field_1).op12 = *(int *)&as->mctop - (int)pIVar3;
          pMVar1 = as->mcbot;
          pMVar4 = pMVar1 + 8;
          as->mcbot = pMVar4;
          as->mclim = pMVar1 + 0x48;
          as->J->mcbot = pMVar4;
          iVar2 = ir->i;
          pMVar4 = as->mcp;
        }
        pIVar3 = (IRIns *)(long)iVar2;
        uVar6 = '%';
        pIVar5 = (IRIns *)(as->mctop + (-(long)pMVar4 - (long)pIVar3));
      }
    }
  }
  (as->mrm).ofs = (int32_t)pIVar5;
  (as->mrm).base = uVar6;
  (as->mrm).idx = 0x80;
  return (Reg)pIVar3;
}

Assistant:

static Reg asm_fuseloadk64(ASMState *as, IRIns *ir)
{
  const uint64_t *k = &ir_k64(ir)->u64;
  if (!LJ_GC64 || checki32((intptr_t)k)) {
    as->mrm.ofs = ptr2addr(k);
    as->mrm.base = RID_NONE;
#if LJ_GC64
  } else if (checki32(dispofs(as, k))) {
    as->mrm.ofs = (int32_t)dispofs(as, k);
    as->mrm.base = RID_DISPATCH;
  } else if (checki32(mcpofs(as, k)) && checki32(mcpofs(as, k+1)) &&
	     checki32(mctopofs(as, k)) && checki32(mctopofs(as, k+1))) {
    as->mrm.ofs = (int32_t)mcpofs(as, k);
    as->mrm.base = RID_RIP;
  } else {  /* Intern 64 bit constant at bottom of mcode. */
    if (ir->i) {
      lj_assertA(*k == *(uint64_t*)(as->mctop - ir->i),
		 "bad interned 64 bit constant");
    } else {
      while ((uintptr_t)as->mcbot & 7) *as->mcbot++ = XI_INT3;
      *(uint64_t*)as->mcbot = *k;
      ir->i = (int32_t)(as->mctop - as->mcbot);
      as->mcbot += 8;
      as->mclim = as->mcbot + MCLIM_REDZONE;
      lj_mcode_commitbot(as->J, as->mcbot);
    }
    as->mrm.ofs = (int32_t)mcpofs(as, as->mctop - ir->i);
    as->mrm.base = RID_RIP;
#endif
  }
  as->mrm.idx = RID_NONE;
  return RID_MRM;
}